

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void cs_impl::array_cs_ext::push_front(array *arr,var *val)

{
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDI;
  value_type *in_stack_ffffffffffffffb8;
  EVP_PKEY_CTX local_20 [8];
  EVP_PKEY_CTX local_18 [24];
  
  any::any((any *)in_RDI,in_stack_ffffffffffffffb8);
  cs::copy(local_18,local_20);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::push_front
            (in_RDI,in_stack_ffffffffffffffb8);
  any::~any((any *)0x42c8c8);
  any::~any((any *)0x42c8d2);
  return;
}

Assistant:

void push_front(array &arr, const var &val)
		{
			arr.push_front(copy(val));
		}